

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O1

void duckdb::ModeFunction<duckdb::ModeStandard<long>>::
     Window<duckdb::ModeState<long,duckdb::ModeStandard<long>>,long,long>
               (AggregateInputData *aggr_input_data,WindowPartitionInput *partition,
               const_data_ptr_t g_state,data_ptr_t l_state,SubFrames *frames,Vector *result,
               idx_t rid)

{
  DataChunk *result_00;
  ulong *puVar1;
  ValidityMask *pVVar2;
  long lVar3;
  pointer pFVar4;
  unsigned_long *puVar5;
  ColumnDataScanState *state;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar6;
  undefined8 uVar7;
  Vector *pVVar8;
  vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *__x;
  ModeState<long,_duckdb::ModeStandard<long>_> *pMVar9;
  ModeIncluded<duckdb::ModeState<long,_duckdb::ModeStandard<long>_>_> *pMVar10;
  undefined8 *puVar11;
  reference pvVar12;
  const_reference pvVar13;
  const_iterator cVar14;
  reference pvVar15;
  TemplatedValidityData<unsigned_long> *pTVar16;
  ulong uVar17;
  FrameBounds *frame;
  pointer pFVar18;
  idx_t seek_idx;
  Updater updater;
  undefined1 local_70 [16];
  data_ptr_t local_60;
  Vector *local_58;
  vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *local_50;
  UpdateWindowState<duckdb::ModeState<long,_duckdb::ModeStandard<long>_>,_long> local_48;
  idx_t local_38;
  
  ModeState<long,_duckdb::ModeStandard<long>_>::InitializePage
            ((ModeState<long,_duckdb::ModeStandard<long>_> *)l_state,partition);
  pVVar2 = partition->filter_mask;
  local_60 = result->data;
  local_58 = result;
  FlatVector::VerifyFlatVector(result);
  if (*(long *)l_state == *(long *)(l_state + 8)) {
    ::std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::resize
              ((vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *)l_state,1);
  }
  local_70._0_8_ = pVVar2;
  local_70._8_8_ = l_state;
  if (*(long *)(l_state + 0x18) == 0) {
    Allocator::DefaultAllocator();
    puVar11 = (undefined8 *)operator_new(0x38);
    *puVar11 = 0;
    puVar11[1] = 0;
    puVar11[4] = 0;
    puVar11[5] = 0;
    puVar11[2] = 0;
    puVar11[3] = 0;
    puVar11[6] = 0;
    *puVar11 = puVar11 + 6;
    puVar11[1] = 1;
    *(undefined4 *)(puVar11 + 4) = 0x3f800000;
    puVar11[5] = 0;
    puVar11[6] = 0;
    *(undefined8 **)(l_state + 0x18) = puVar11;
  }
  local_50 = &frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>;
  if (*(ulong *)(*(long *)(l_state + 0x18) + 0x18) >> 2 < *(ulong *)(l_state + 0x28)) {
    pvVar12 = vector<duckdb::FrameBounds,_true>::back((vector<duckdb::FrameBounds,_true> *)l_state);
    uVar17 = pvVar12->end;
    pvVar13 = vector<duckdb::FrameBounds,_true>::front(frames);
    if (pvVar13->start < uVar17) {
      pvVar13 = vector<duckdb::FrameBounds,_true>::back(frames);
      uVar17 = pvVar13->end;
      pvVar12 = vector<duckdb::FrameBounds,_true>::front
                          ((vector<duckdb::FrameBounds,_true> *)l_state);
      if (pvVar12->start < uVar17) {
        local_48.included =
             (ModeIncluded<duckdb::ModeState<long,_duckdb::ModeStandard<long>_>_> *)local_70;
        local_48.state = (ModeState<long,_duckdb::ModeStandard<long>_> *)l_state;
        AggregateExecutor::
        IntersectFrames<duckdb::ModeFunction<duckdb::ModeStandard<long>>::UpdateWindowState<duckdb::ModeState<long,duckdb::ModeStandard<long>>,long>>
                  ((SubFrames *)l_state,frames,&local_48);
        goto LAB_01ab07c8;
      }
    }
  }
  if (*(_Hashtable<long,_std::pair<const_long,_duckdb::ModeAttr>,_std::allocator<std::pair<const_long,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        **)(l_state + 0x18) !=
      (_Hashtable<long,_std::pair<const_long,_duckdb::ModeAttr>,_std::allocator<std::pair<const_long,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       *)0x0) {
    ::std::
    _Hashtable<long,_std::pair<const_long,_duckdb::ModeAttr>,_std::allocator<std::pair<const_long,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(*(_Hashtable<long,_std::pair<const_long,_duckdb::ModeAttr>,_std::allocator<std::pair<const_long,_duckdb::ModeAttr>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              **)(l_state + 0x18));
  }
  l_state[0x28] = '\0';
  l_state[0x29] = '\0';
  l_state[0x2a] = '\0';
  l_state[0x2b] = '\0';
  l_state[0x2c] = '\0';
  l_state[0x2d] = '\0';
  l_state[0x2e] = '\0';
  l_state[0x2f] = '\0';
  l_state[0x38] = '\0';
  l_state[0x39] = '\0';
  l_state[0x3a] = '\0';
  l_state[0x3b] = '\0';
  l_state[0x3c] = '\0';
  l_state[0x3d] = '\0';
  l_state[0x3e] = '\0';
  l_state[0x3f] = '\0';
  l_state[0x30] = '\0';
  pFVar4 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
           super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pFVar18 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
                 super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                 _M_impl.super__Vector_impl_data._M_start; pFVar18 != pFVar4; pFVar18 = pFVar18 + 1)
  {
    for (seek_idx = pFVar18->start; uVar7 = local_70._8_8_, seek_idx < pFVar18->end;
        seek_idx = seek_idx + 1) {
      puVar5 = ((TemplatedValidityMask<unsigned_long> *)local_70._0_8_)->validity_mask;
      if ((puVar5 == (unsigned_long *)0x0) ||
         ((puVar5[seek_idx >> 6] >> (seek_idx & 0x3f) & 1) != 0)) {
        state = *(ColumnDataScanState **)(local_70._8_8_ + 0x48);
        if ((state->next_row_index <= seek_idx) || (seek_idx < state->current_row_index)) {
          result_00 = (DataChunk *)(local_70._8_8_ + 0x50);
          ColumnDataCollection::Seek
                    (*(ColumnDataCollection **)(local_70._8_8_ + 0x40),seek_idx,state,result_00);
          pvVar15 = vector<duckdb::Vector,_true>::operator[]
                              ((vector<duckdb::Vector,_true> *)result_00,0);
          *(data_ptr_t *)(uVar7 + 0x90) = pvVar15->data;
          pvVar15 = vector<duckdb::Vector,_true>::operator[]
                              ((vector<duckdb::Vector,_true> *)result_00,0);
          FlatVector::VerifyFlatVector(pvVar15);
          *(ValidityMask **)(uVar7 + 0x98) = &pvVar15->validity;
        }
        if ((**(long **)(uVar7 + 0x98) == 0) ||
           (uVar17 = seek_idx - *(long *)(*(long *)(uVar7 + 0x48) + 0x50),
           (*(ulong *)(**(long **)(uVar7 + 0x98) + (uVar17 >> 6 & 0x3ffffff) * 8) >> (uVar17 & 0x3f)
           & 1) != 0)) {
          ModeState<long,_duckdb::ModeStandard<long>_>::ModeAdd
                    ((ModeState<long,_duckdb::ModeStandard<long>_> *)l_state,seek_idx);
        }
      }
    }
  }
LAB_01ab07c8:
  if (l_state[0x30] == '\0') {
    cVar14 = ModeState<long,_duckdb::ModeStandard<long>_>::Scan
                       ((ModeState<long,_duckdb::ModeStandard<long>_> *)l_state);
    if (cVar14.super__Node_iterator_base<std::pair<const_long,_duckdb::ModeAttr>,_false>._M_cur !=
        (__node_type *)0x0) {
      **(undefined8 **)(l_state + 0x20) =
           *(undefined8 *)
            ((long)cVar14.super__Node_iterator_base<std::pair<const_long,_duckdb::ModeAttr>,_false>.
                   _M_cur + 8);
      lVar3 = *(long *)((long)cVar14.
                              super__Node_iterator_base<std::pair<const_long,_duckdb::ModeAttr>,_false>
                              ._M_cur + 0x10);
      *(long *)(l_state + 0x38) = lVar3;
      l_state[0x30] = lVar3 != 0;
    }
  }
  __x = local_50;
  pVVar8 = local_58;
  if (l_state[0x30] == '\x01') {
    *(undefined8 *)(local_60 + rid * 8) = **(undefined8 **)(l_state + 0x20);
  }
  else {
    if ((local_58->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      local_38 = (local_58->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&local_48,&local_38);
      pMVar10 = local_48.included;
      pMVar9 = local_48.state;
      local_48.state = (ModeState<long,_duckdb::ModeStandard<long>_> *)0x0;
      local_48.included = (ModeIncluded<duckdb::ModeState<long,_duckdb::ModeStandard<long>_>_> *)0x0
      ;
      this = (pVVar8->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (pVVar8->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)pMVar9;
      (pVVar8->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pMVar10;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.included !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.included);
      }
      pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          (&(pVVar8->validity).super_TemplatedValidityMask<unsigned_long>.
                            validity_data);
      (pVVar8->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)
           (pTVar16->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    bVar6 = (byte)rid & 0x3f;
    puVar1 = (pVVar8->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
             (rid >> 6);
    *puVar1 = *puVar1 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
  }
  ::std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::operator=
            ((vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *)l_state,__x);
  return;
}

Assistant:

static void Window(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition,
	                   const_data_ptr_t g_state, data_ptr_t l_state, const SubFrames &frames, Vector &result,
	                   idx_t rid) {
		auto &state = *reinterpret_cast<STATE *>(l_state);

		state.InitializePage(partition);
		const auto &fmask = partition.filter_mask;

		auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
		auto &rmask = FlatVector::Validity(result);
		auto &prevs = state.prevs;
		if (prevs.empty()) {
			prevs.resize(1);
		}

		ModeIncluded<STATE> included(fmask, state);

		if (!state.frequency_map) {
			state.frequency_map = TYPE_OP::CreateEmpty(Allocator::DefaultAllocator());
		}
		const size_t tau_inverse = 4; // tau==0.25
		if (state.nonzero <= (state.frequency_map->size() / tau_inverse) || prevs.back().end <= frames.front().start ||
		    frames.back().end <= prevs.front().start) {
			state.Reset();
			// for f ∈ F do
			for (const auto &frame : frames) {
				for (auto i = frame.start; i < frame.end; ++i) {
					if (included(i)) {
						state.ModeAdd(i);
					}
				}
			}
		} else {
			using Updater = UpdateWindowState<STATE, INPUT_TYPE>;
			Updater updater(state, included);
			AggregateExecutor::IntersectFrames(prevs, frames, updater);
		}

		if (!state.valid) {
			// Rescan
			auto highest_frequency = state.Scan();
			if (highest_frequency != state.frequency_map->end()) {
				*(state.mode) = highest_frequency->first;
				state.count = highest_frequency->second.count;
				state.valid = (state.count > 0);
			}
		}

		if (state.valid) {
			rdata[rid] = TYPE_OP::template Assign<INPUT_TYPE, RESULT_TYPE>(result, *state.mode);
		} else {
			rmask.Set(rid, false);
		}

		prevs = frames;
	}